

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O0

void * __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
try_allocate_page<(density::detail::page_allocation_type)1>
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,
          progress_guarantee i_progress_guarantee)

{
  PageStack *this_00;
  WF_PageStack *this_01;
  void *pvVar1;
  PageFooter *local_20;
  PageFooter *new_page;
  progress_guarantee i_progress_guarantee_local;
  PageAllocator<density::detail::SystemPageManager<65536UL>_> *this_local;
  
  process_pending_unpins(this,i_progress_guarantee);
  this_00 = get_private_stack(this,zeroed);
  local_20 = PageStack::pop_unpinned(this_00);
  if (local_20 == (PageFooter *)0x0) {
    this_01 = PageAllocatorSlot::get_stack(this->m_current_slot,zeroed);
    local_20 = WF_PageStack::try_pop_unpinned(this_01);
    if ((local_20 == (PageFooter *)0x0) &&
       (local_20 = try_steal_and_allocate(this,zeroed), local_20 == (PageFooter *)0x0)) {
      local_20 = allocate_page_slow_path(this,zeroed,i_progress_guarantee);
    }
  }
  pvVar1 = address_lower_align(local_20,0x10000);
  return pvVar1;
}

Assistant:

void * try_allocate_page(progress_guarantee i_progress_guarantee) noexcept
            {
                process_pending_unpins(i_progress_guarantee);

                // try from the private stack...
                auto * new_page = get_private_stack(ALLOCATION_TYPE).pop_unpinned();
                if (new_page == nullptr)
                {
                    // ...then from the current slot...
                    new_page = m_current_slot->get_stack(ALLOCATION_TYPE).try_pop_unpinned();
                    if (new_page == nullptr)
                    {
                        // ...else try to steal all the pages from the victim slot...
                        new_page = try_steal_and_allocate(ALLOCATION_TYPE);

                        // if still do not have a page, we go to the next level
                        if (new_page == nullptr)
                        {
                            new_page =
                              allocate_page_slow_path(ALLOCATION_TYPE, i_progress_guarantee);
                        }
                    }
                }

                // flush any pending write
                if (enable_relaxed_atomics)
                    std::atomic_thread_fence(std::memory_order_release);

                return address_lower_align(new_page, page_alignment);
            }